

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

Component ftxui::Menu(ConstStringListRef entries,int *selected,Ref<ftxui::MenuOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar1;
  Ref<ftxui::MenuOption> *in_R8;
  Component CVar2;
  undefined1 local_39;
  MenuBase *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  Ref<ftxui::MenuOption> *local_28;
  ConstStringListRef local_20;
  
  local_20.ref_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)entries.ref_wide_;
  peVar1 = (element_type *)entries.ref_;
  local_38 = (MenuBase *)0x0;
  local_28 = option;
  local_20.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)selected;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::MenuBase,std::allocator<ftxui::MenuBase>,ftxui::ConstStringListRef&,int*&,ftxui::Ref<ftxui::MenuOption>&>
            (&_Stack_30,&local_38,(allocator<ftxui::MenuBase> *)&local_39,&local_20,
             (int **)&local_28,in_R8);
  peVar1->_vptr_ComponentBase = (_func_int **)local_38;
  (peVar1->children_).
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_30._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Menu(ConstStringListRef entries,
               int* selected,
               Ref<MenuOption> option) {
  return Make<MenuBase>(entries, selected, std::move(option));
}